

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence.h
# Opt level: O3

gcstring * GenApi_3_4::TrimSpace(gcstring *s,istream *is)

{
  ulong uVar1;
  byte bVar2;
  ushort uVar3;
  ulong uVar4;
  char *pcVar5;
  ctype *pcVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  locale local_50 [8];
  istream *local_48;
  istream *local_40;
  ulong local_38;
  
  uVar4 = (**(code **)(*(long *)s + 0x80))();
  local_48 = is + 0xd0;
  local_40 = is;
  if (uVar4 == 0) {
    uVar10 = 0;
  }
  else {
    uVar9 = 0;
    do {
      pcVar5 = GenICam_3_4::gcstring::operator_cast_to_char_(s);
      bVar2 = pcVar5[uVar9];
      std::locale::locale(local_50,(locale *)(local_48 + *(long *)(*(long *)local_40 + -0x18)));
      pcVar6 = std::use_facet<std::ctype<char>>(local_50);
      uVar3 = *(ushort *)(*(long *)(pcVar6 + 0x30) + (ulong)bVar2 * 2);
      std::locale::~locale(local_50);
      uVar10 = uVar9;
      if ((uVar3 >> 0xd & 1) == 0) break;
      uVar9 = uVar9 + 1;
      uVar10 = uVar4;
    } while (uVar4 != uVar9);
  }
  uVar9 = uVar4 - 1;
  if (uVar10 < uVar4 - 1) {
    uVar9 = uVar10;
  }
  local_38 = uVar9 + 1;
  do {
    uVar1 = uVar4 - 1;
    uVar7 = uVar9;
    uVar8 = local_38;
    if (uVar1 <= uVar10) break;
    pcVar5 = GenICam_3_4::gcstring::operator_cast_to_char_(s);
    bVar2 = pcVar5[uVar4 - 1];
    std::locale::locale(local_50,(locale *)(local_48 + *(long *)(*(long *)local_40 + -0x18)));
    pcVar6 = std::use_facet<std::ctype<char>>(local_50);
    uVar3 = *(ushort *)(*(long *)(pcVar6 + 0x30) + (ulong)bVar2 * 2);
    std::locale::~locale(local_50);
    uVar7 = uVar1;
    uVar8 = uVar4;
    uVar4 = uVar1;
  } while ((uVar3 >> 0xd & 1) != 0);
  uVar4 = (**(code **)(*(long *)s + 0x80))(s);
  if (uVar7 < uVar4) {
    (**(code **)(*(long *)s + 0xa0))(s,uVar8,0xffffffffffffffff);
  }
  (**(code **)(*(long *)s + 0xa0))(s,0,uVar10);
  return s;
}

Assistant:

inline GENICAM_NAMESPACE::gcstring& TrimSpace( GENICAM_NAMESPACE::gcstring& s, std::istream& is )
    {
        size_t iend =s.length();
        size_t ibegin = 0;
        for (; ibegin < iend && std::isspace( s[ibegin], is.getloc() ); ++ibegin);
        for (--iend; ibegin < iend; --iend)
        {
            if (!std::isspace( s[iend], is.getloc() ))
                break;
        }
        if (iend < s.length())
        {
            s.erase(iend + 1);
        }
        s.erase( 0, ibegin );

        return s;
    }